

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5ExprNode *
sqlite3Fts5ParseImplicitAnd(Fts5Parse *pParse,Fts5ExprNode *pLeft,Fts5ExprNode *pRight)

{
  Fts5ExprNode *p;
  Fts5ExprNode *in_RDX;
  Fts5ExprNode *in_RSI;
  Fts5ExprNode *in_RDI;
  int unaff_retaddr;
  Fts5ExprPhrase **ap;
  Fts5ExprNode *pPrev;
  Fts5ExprNode *pRet;
  Fts5ExprNode *in_stack_ffffffffffffffd0;
  Fts5ExprNode *local_28;
  Fts5ExprNode *local_20;
  
  local_20 = (Fts5ExprNode *)0x0;
  if (*(int *)&in_RDI->xNext == 0) {
    local_28 = in_RSI;
    if (in_RSI->eType == 2) {
      local_28 = in_RSI->apChild[in_RSI->nChild + -1];
    }
    if (in_RDX->eType == 0) {
      local_20 = in_RSI;
      sqlite3Fts5ParseNodeFree(in_stack_ffffffffffffffd0);
      *(int *)((long)&in_RDI->xNext + 4) = *(int *)((long)&in_RDI->xNext + 4) + -1;
    }
    else if (local_28->eType == 0) {
      local_20 = in_RDX;
      if (local_28 != in_RSI) {
        in_RSI->apChild[in_RSI->nChild + -1] = in_RDX;
        local_20 = in_RSI;
      }
      p = (Fts5ExprNode *)
          (in_RDI->iRowid +
          (long)((*(int *)((long)&in_RDI->xNext + 4) + -1) - in_RDX->pNear->nPhrase) * 8);
      memmove(p,&p->bNomatch,(long)in_RDX->pNear->nPhrase << 3);
      *(int *)((long)&in_RDI->xNext + 4) = *(int *)((long)&in_RDI->xNext + 4) + -1;
      sqlite3Fts5ParseNodeFree(p);
    }
    else {
      local_20 = sqlite3Fts5ParseNode
                           ((Fts5Parse *)ap,unaff_retaddr,in_RDI,in_RSI,(Fts5ExprNearset *)in_RDX);
    }
  }
  else {
    sqlite3Fts5ParseNodeFree(in_stack_ffffffffffffffd0);
    sqlite3Fts5ParseNodeFree(in_stack_ffffffffffffffd0);
  }
  return local_20;
}

Assistant:

static Fts5ExprNode *sqlite3Fts5ParseImplicitAnd(
  Fts5Parse *pParse,              /* Parse context */
  Fts5ExprNode *pLeft,            /* Left hand child expression */
  Fts5ExprNode *pRight            /* Right hand child expression */
){
  Fts5ExprNode *pRet = 0;
  Fts5ExprNode *pPrev;

  if( pParse->rc ){
    sqlite3Fts5ParseNodeFree(pLeft);
    sqlite3Fts5ParseNodeFree(pRight);
  }else{

    assert( pLeft->eType==FTS5_STRING
        || pLeft->eType==FTS5_TERM
        || pLeft->eType==FTS5_EOF
        || pLeft->eType==FTS5_AND
    );
    assert( pRight->eType==FTS5_STRING
        || pRight->eType==FTS5_TERM
        || pRight->eType==FTS5_EOF
        || (pRight->eType==FTS5_AND && pParse->bPhraseToAnd)
    );

    if( pLeft->eType==FTS5_AND ){
      pPrev = pLeft->apChild[pLeft->nChild-1];
    }else{
      pPrev = pLeft;
    }
    assert( pPrev->eType==FTS5_STRING
        || pPrev->eType==FTS5_TERM
        || pPrev->eType==FTS5_EOF
        );

    if( pRight->eType==FTS5_EOF ){
      assert( pParse->apPhrase!=0 );
      assert( pParse->nPhrase>0 );
      assert( pParse->apPhrase[pParse->nPhrase-1]==pRight->pNear->apPhrase[0] );
      sqlite3Fts5ParseNodeFree(pRight);
      pRet = pLeft;
      pParse->nPhrase--;
    }
    else if( pPrev->eType==FTS5_EOF ){
      Fts5ExprPhrase **ap;

      if( pPrev==pLeft ){
        pRet = pRight;
      }else{
        pLeft->apChild[pLeft->nChild-1] = pRight;
        pRet = pLeft;
      }

      ap = &pParse->apPhrase[pParse->nPhrase-1-pRight->pNear->nPhrase];
      assert( ap[0]==pPrev->pNear->apPhrase[0] );
      memmove(ap, &ap[1], sizeof(Fts5ExprPhrase*)*pRight->pNear->nPhrase);
      pParse->nPhrase--;

      sqlite3Fts5ParseNodeFree(pPrev);
    }
    else{
      pRet = sqlite3Fts5ParseNode(pParse, FTS5_AND, pLeft, pRight, 0);
    }
  }

  return pRet;
}